

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O2

int Aig_ManPartitionedSat
              (Aig_Man_t *p,int nAlgo,int nPartSize,int nConfPart,int nConfTotal,int fAlignPol,
              int fSynthesize,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Vec_Int_t *pVVar5;
  abctime aVar6;
  Vec_Ptr_t *p_00;
  Aig_Man_t *pAVar7;
  Aig_Man_t *pAVar8;
  sat_solver *pSat;
  Vec_Int_t *pVVar9;
  Vec_Ptr_t *vPartPos;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint local_70;
  Vec_Vec_t *vPart2Pos;
  Vec_Vec_t *vPio2Id;
  
  aVar4 = Abc_Clock();
  switch(nAlgo) {
  case 0:
    pVVar5 = Aig_ManPartitionMonolithic(p);
    goto LAB_00557b8f;
  case 1:
    pVVar5 = Aig_ManPartitionLevelized(p,nPartSize);
    goto LAB_00557b8f;
  case 2:
    iVar1 = 0;
    break;
  case 3:
    iVar1 = 1;
    break;
  default:
    puts("Unknown partitioning algorithm.");
    return -1;
  }
  pVVar5 = Aig_ManPartitionDfs(p,nPartSize,iVar1);
LAB_00557b8f:
  if (fVerbose != 0) {
    iVar1 = Vec_IntFindMax(pVVar5);
    iVar13 = 0x81964d;
    printf("Partitioning derived %d partitions. ",(ulong)(iVar1 + 1));
    Abc_Print(iVar13,"%s =","Time");
    aVar6 = Abc_Clock();
    Abc_Print(iVar13,"%9.2f sec\n",(double)(aVar6 - aVar4) / 1000000.0);
  }
  p_00 = Aig_ManPartSplit(p,pVVar5,(Vec_Ptr_t **)&vPio2Id,(Vec_Ptr_t **)&vPart2Pos);
  Vec_IntFree(pVVar5);
  if (fVerbose != 0) {
    iVar1 = 0x819672;
    printf("Partions were transformed into AIGs. ");
    Abc_Print(iVar1,"%s =","Time");
    aVar6 = Abc_Clock();
    Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar6 - aVar4) / 1000000.0);
  }
  if (fSynthesize != 0) {
    uVar11 = 0;
    uVar14 = (ulong)(uint)p_00->nSize;
    if (p_00->nSize < 1) {
      uVar14 = uVar11;
    }
    for (; uVar14 != uVar11; uVar11 = uVar11 + 1) {
      pAVar7 = (Aig_Man_t *)Vec_PtrEntry(p_00,(int)uVar11);
      pAVar8 = Dar_ManRwsat(pAVar7,0,0);
      p_00->pArray[uVar11] = pAVar8;
      Aig_ManStop(pAVar7);
    }
  }
  pSat = sat_solver_new();
  pVVar5 = Vec_IntStart(p->vObjs->nSize);
  uVar10 = p_00->nSize;
  if ((int)uVar10 < 1) {
    uVar10 = 0;
  }
  local_70 = 0;
  uVar12 = 0;
  iVar1 = -1;
  iVar13 = nConfTotal;
  do {
    if (uVar10 == uVar12) goto LAB_00557e6e;
    pAVar7 = (Aig_Man_t *)Vec_PtrEntry(p_00,uVar12);
    aVar4 = Abc_Clock();
    if (fAlignPol == 0) {
      Aig_ManPartResetNodePolarity(pAVar7);
    }
    else {
      pVVar9 = Vec_VecEntryInt(vPio2Id,uVar12);
      Aig_ManPartSetNodePolarity(p,pAVar7,pVVar9);
    }
    pVVar9 = Vec_VecEntryInt(vPio2Id,uVar12);
    vPartPos = Vec_VecEntry(vPart2Pos,uVar12);
    Aig_ManAddNewCnfToSolver(pSat,pAVar7,pVVar5,pVVar9,vPartPos,fAlignPol);
    iVar2 = sat_solver_solve(pSat,(lit *)0x0,(lit *)0x0,(long)iVar13,0,0,0);
    if (fVerbose != 0) {
      local_70 = local_70 + pAVar7->nObjs[5] + pAVar7->nObjs[6];
      uVar3 = sat_solver_nvars(pSat);
      iVar1 = 0x819698;
      printf("%4d : Aig = %6d. Vs = %7d. RootCs = %7d. LearnCs = %6d. ",(ulong)uVar12,
             (ulong)local_70,(ulong)uVar3,(ulong)(pSat->stats).clauses,(ulong)(pSat->stats).learnts)
      ;
      Abc_Print(iVar1,"%s =","Time");
      aVar6 = Abc_Clock();
      Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar6 - aVar4) / 1000000.0);
    }
    iVar1 = 0;
    if (iVar2 != 1) {
      if (iVar2 == -1) {
        iVar1 = 1;
        goto LAB_00557ea7;
      }
      iVar1 = -1;
    }
    iVar13 = iVar13 - (int)(pSat->stats).conflicts;
    uVar12 = uVar12 + 1;
  } while (0 < iVar13);
  printf("Exceeded the limit on the total number of conflicts (%d).\n",(ulong)(uint)nConfTotal);
LAB_00557e6e:
  if (iVar1 == 0) {
    Aig_ManDeriveCounterExample(p,pVVar5,pSat);
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
LAB_00557ea7:
  sat_solver_delete(pSat);
  for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
    pAVar7 = (Aig_Man_t *)Vec_PtrEntry(p_00,uVar12);
    Aig_ManStop(pAVar7);
  }
  Vec_PtrFree(p_00);
  Vec_VecFree(vPio2Id);
  Vec_VecFree(vPart2Pos);
  Vec_IntFree(pVVar5);
  return iVar1;
}

Assistant:

int Aig_ManPartitionedSat( Aig_Man_t * p, int nAlgo, int nPartSize, 
    int nConfPart, int nConfTotal, int fAlignPol, int fSynthesize, int fVerbose )
{
    sat_solver * pSat;
    Vec_Ptr_t * vAigs;
    Vec_Vec_t * vPio2Id, * vPart2Pos;
    Aig_Man_t * pAig, * pTemp;
    Vec_Int_t * vNode2Part, * vNode2Var;
    int nConfRemaining = nConfTotal, nNodes = 0;
    int i, status, RetValue = -1;
    abctime clk;

    // perform partitioning according to the selected algorithm
    clk = Abc_Clock();
    switch ( nAlgo )
    {
    case 0: 
        vNode2Part = Aig_ManPartitionMonolithic( p );
        break;
    case 1: 
        vNode2Part = Aig_ManPartitionLevelized( p, nPartSize );
        break;
    case 2: 
        vNode2Part = Aig_ManPartitionDfs( p, nPartSize, 0 );
        break;
    case 3: 
        vNode2Part = Aig_ManPartitionDfs( p, nPartSize, 1 );
        break;
    default:
        printf( "Unknown partitioning algorithm.\n" );
        return -1;
    }

    if ( fVerbose )
    {
    printf( "Partitioning derived %d partitions. ", Vec_IntFindMax(vNode2Part) + 1 );
    ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // split the original AIG into partition AIGs (vAigs)
    // also, derives mapping of PIs/POs of partition AIGs into original nodes
    // also, derives mapping of POs of the original AIG into partitions
    vAigs = Aig_ManPartSplit( p, vNode2Part, (Vec_Ptr_t **)&vPio2Id, (Vec_Ptr_t **)&vPart2Pos );
    Vec_IntFree( vNode2Part );

    if ( fVerbose )
    {
    printf( "Partions were transformed into AIGs. " );
    ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // synthesize partitions
    if ( fSynthesize )
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
    {
        pAig = Dar_ManRwsat( pTemp = pAig, 0, 0 );
        Vec_PtrWriteEntry( vAigs, i, pAig );
        Aig_ManStop( pTemp );
    }

    // start the SAT solver
    pSat = sat_solver_new();
//    pSat->verbosity = fVerbose;
    // start mapping of the original AIG IDs into their SAT variable numbers
    vNode2Var = Vec_IntStart( Aig_ManObjNumMax(p) );

    // add partitions, one at a time, and run the SAT solver 
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
    {
clk = Abc_Clock();
        // transform polarity of the AIG
        if ( fAlignPol )
            Aig_ManPartSetNodePolarity( p, pAig, Vec_VecEntryInt(vPio2Id,i) );
        else
            Aig_ManPartResetNodePolarity( pAig );
        // add CNF of this partition to the SAT solver
        if ( Aig_ManAddNewCnfToSolver( pSat, pAig, vNode2Var, 
            Vec_VecEntryInt(vPio2Id,i), Vec_VecEntry(vPart2Pos,i), fAlignPol ) )
        {
            RetValue = 1;
            break;
        }
        // call the SAT solver
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfRemaining, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( fVerbose )
        {
            printf( "%4d : Aig = %6d. Vs = %7d. RootCs = %7d. LearnCs = %6d. ",
                i, nNodes += Aig_ManNodeNum(pAig), sat_solver_nvars(pSat), 
                (int)pSat->stats.clauses, (int)pSat->stats.learnts );
ABC_PRT( "Time", Abc_Clock() - clk );
        }
        // analize the result
        if ( status == l_False )
        {
            RetValue = 1;
            break;
        }
        else if ( status == l_True )
            RetValue = 0;
        else
            RetValue = -1;
        nConfRemaining -= pSat->stats.conflicts;
        if ( nConfRemaining <= 0 )
        {
            printf( "Exceeded the limit on the total number of conflicts (%d).\n", nConfTotal );
            break;
        }
    }
    if ( RetValue == 0 )
        Aig_ManDeriveCounterExample( p, vNode2Var, pSat );
    // cleanup
    sat_solver_delete( pSat );
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pTemp, i )
        Aig_ManStop( pTemp );
    Vec_PtrFree( vAigs );
    Vec_VecFree( vPio2Id );
    Vec_VecFree( vPart2Pos );
    Vec_IntFree( vNode2Var );
    return RetValue;
}